

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_hv_accept.cpp
# Opt level: O2

int __thiscall
ir_function::accept(ir_function *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  int iVar1;
  ir_visitor_status iVar2;
  int iVar3;
  undefined4 in_register_00000034;
  ir_hierarchical_visitor *v;
  
  v = (ir_hierarchical_visitor *)CONCAT44(in_register_00000034,__fd);
  iVar1 = (*v->_vptr_ir_hierarchical_visitor[0xc])(v,this);
  if (iVar1 == 0) {
    iVar2 = visit_list_elements(v,&this->signatures,false);
    if (iVar2 != visit_stop) {
      iVar1 = (*v->_vptr_ir_hierarchical_visitor[0xd])(v,this);
      return iVar1;
    }
    iVar3 = 2;
  }
  else {
    iVar3 = 0;
    if (iVar1 != 1) {
      iVar3 = iVar1;
    }
  }
  return iVar3;
}

Assistant:

ir_visitor_status
ir_function::accept(ir_hierarchical_visitor *v)
{
   ir_visitor_status s = v->visit_enter(this);
   if (s != visit_continue)
      return (s == visit_continue_with_parent) ? visit_continue : s;

   s = visit_list_elements(v, &this->signatures, false);
   return (s == visit_stop) ? s : v->visit_leave(this);
}